

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O0

ecvt_result * mjs::anon_unknown_1::do_ecvt(ecvt_result *__return_storage_ptr__,double m,int k)

{
  long lVar1;
  bool bVar2;
  int local_44;
  char *pcStack_40;
  int i;
  char *exp;
  char temp [32];
  int k_local;
  double m_local;
  
  temp._28_4_ = k;
  if (k < 1) {
    __assert_fail("k >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0x12,"ecvt_result mjs::(anonymous namespace)::do_ecvt(double, int)");
  }
  __return_storage_ptr__->k = k;
  snprintf((char *)&exp,0x20,"%1.*e",m,(ulong)(k - 1));
  __return_storage_ptr__->s[0] = (char)exp;
  if (1 < (int)temp._28_4_) {
    if (exp._1_1_ != '.') {
      __assert_fail("temp[1] == \'.\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                    ,0x1b,"ecvt_result mjs::(anonymous namespace)::do_ecvt(double, int)");
    }
    memcpy(__return_storage_ptr__->s + 1,(void *)((long)&exp + 2),(long)(temp._28_4_ + -1));
  }
  lVar1 = (long)(int)(temp._28_4_ + (uint)(1 < (int)temp._28_4_) + 1);
  pcStack_40 = temp + lVar1 + -8;
  bVar2 = false;
  if ((*(char *)((long)&i + lVar1 + 3) == 'e') && (bVar2 = true, *pcStack_40 != '+')) {
    bVar2 = *pcStack_40 == '-';
  }
  if (bVar2) {
    __return_storage_ptr__->n = 0;
    for (local_44 = 1; pcStack_40[local_44] != '\0'; local_44 = local_44 + 1) {
      __return_storage_ptr__->n = __return_storage_ptr__->n * 10 + (int)pcStack_40[local_44] + -0x30
      ;
    }
    if (*pcStack_40 == '-') {
      __return_storage_ptr__->n = -__return_storage_ptr__->n;
    }
    __return_storage_ptr__->n = __return_storage_ptr__->n + 1;
    __return_storage_ptr__->s[(int)temp._28_4_] = '\0';
    return __return_storage_ptr__;
  }
  __assert_fail("exp[-1] == \'e\' && (exp[0] == \'+\' || exp[0] == \'-\')",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0x1f,"ecvt_result mjs::(anonymous namespace)::do_ecvt(double, int)");
}

Assistant:

ecvt_result do_ecvt(double m, int k) {
    assert(k >= 1); // k is the number of decimal digits in the representation

    ecvt_result res;
    res.k = k;
#if 1
    char temp[32];
    snprintf(temp, sizeof(temp), "%1.*e", k-1, m);
    res.s[0] = temp[0];
    if (k > 1) {
        assert(temp[1] == '.');
        std::memcpy(&res.s[1], &temp[2], k-1);
    }
    const char* exp = &temp[k+(k>1)+1];
    assert(exp[-1] == 'e' && (exp[0] == '+' || exp[0] == '-'));
    res.n = 0;
    for (int i = 1; exp[i]; ++i) {
        res.n = res.n*10 + exp[i] - '0';
    }
    if (exp[0] == '-') {
        res.n = -res.n;
    }
    ++res.n; // Adjust for "1." format part
#else
    int sign;                   // sign is set if the value is negative (never true since to_string handles that)
#ifdef _MSC_VER
    char s[_CVTBUFSIZE + 1];    // s is the decimal representation of the number
    _ecvt_s(s, m, k, &res.n, &sign);
#else
    const char* s = ecvt(m, k, &res.n, &sign);
#endif
    assert(sign == 0);
    assert((int)std::strlen(s) == k);
    std::memcpy(res.s, s, k);
#endif
    res.s[k] = '\0';
    return res;
}